

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::udf_avg_state_t<int>,int,duckdb::UDFAverageFunction>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  udf_avg_state_t<int> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  int *rdata_1;
  udf_avg_state_t<int> **sdata_1;
  AggregateFinalizeData finalize_data;
  int *rdata;
  udf_avg_state_t<int> **sdata;
  int *in_stack_ffffffffffffff78;
  udf_avg_state_t<int> *in_stack_ffffffffffffff80;
  udf_avg_state_t<int> *state;
  AggregateFinalizeData local_78;
  int *local_60;
  udf_avg_state_t<int> **local_58;
  AggregateFinalizeData local_50;
  int *local_38;
  udf_avg_state_t<int> **local_30;
  long local_28;
  udf_avg_state_t<int> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::udf_avg_state_t<int>*>((Vector *)0x5132e0);
    local_38 = ConstantVector::GetData<int>((Vector *)0x5132ef);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    UDFAverageFunction::Finalize<int,duckdb::udf_avg_state_t<int>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x51331f
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::udf_avg_state_t<int>*>((Vector *)0x51333d);
    local_60 = FlatVector::GetData<int>((Vector *)0x51334c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (udf_avg_state_t<int> *)0x0; state < local_20;
        state = (udf_avg_state_t<int> *)((long)&state->count + 1)) {
      local_78.result_idx = (long)&state->count + local_28;
      UDFAverageFunction::Finalize<int,duckdb::udf_avg_state_t<int>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x5133b2);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}